

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::PlotBarsHEx<ImPlot::GetterBarH<int>,double>
               (char *label_id,GetterBarH<int> *getter,double height)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int *piVar7;
  ImPlotPlot *pIVar8;
  double dVar9;
  ImPlotContext *pIVar10;
  bool bVar11;
  ImU32 col;
  ImU32 col_00;
  ImDrawList *this;
  int iVar12;
  int iVar13;
  int iVar14;
  ImPlotRange *pIVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  ImVec2 b;
  ImVec2 a;
  byte local_5c;
  ImVec2 local_40;
  ImVec2 local_38;
  
  bVar11 = BeginItem(label_id,1);
  pIVar10 = GImPlot;
  if (bVar11) {
    dVar21 = height * 0.5;
    if ((GImPlot->FitThisFrame == true) && (iVar12 = getter->Count, 0 < iVar12)) {
      piVar7 = getter->Xs;
      iVar14 = getter->Offset;
      iVar2 = getter->Stride;
      dVar16 = getter->YShift;
      pIVar8 = GImPlot->CurrentPlot;
      iVar3 = pIVar8->CurrentYAxis;
      uVar4 = (pIVar8->XAxis).Flags;
      pIVar15 = GImPlot->ExtentsY + iVar3;
      uVar5 = pIVar8->YAxis[iVar3].Flags;
      iVar13 = 0;
      dVar17 = 0.0;
      do {
        iVar6 = *(int *)((long)piVar7 +
                        (long)(((iVar14 + iVar13) % iVar12 + iVar12) % iVar12) * (long)iVar2);
        dVar18 = dVar16 + dVar17;
        dVar9 = dVar18 - dVar21;
        if ((uVar4 >> 10 & 1) == 0) {
          if ((uVar4 & 0x20) == 0) {
LAB_001f9d17:
            dVar19 = (pIVar10->ExtentsX).Min;
            dVar20 = 0.0;
            if (dVar19 <= 0.0) {
              dVar20 = dVar19;
            }
            (pIVar10->ExtentsX).Min = dVar20;
            dVar19 = (pIVar10->ExtentsX).Max;
            dVar20 = 0.0;
            if (0.0 <= dVar19) {
              dVar20 = dVar19;
            }
            (pIVar10->ExtentsX).Max = dVar20;
          }
        }
        else if ((((uVar4 & 0x20) == 0) && (pIVar8->YAxis[iVar3].Range.Min <= dVar9)) &&
                (dVar9 <= pIVar8->YAxis[iVar3].Range.Max)) goto LAB_001f9d17;
        if ((uVar5 >> 10 & 1) == 0) {
          if ((long)ABS(dVar9) < 0x7ff0000000000000) {
LAB_001f9d75:
            if ((0.0 < dVar9) || ((uVar5 & 0x20) == 0)) {
              dVar19 = dVar9;
              if (pIVar15->Min <= dVar9) {
                dVar19 = pIVar15->Min;
              }
              pIVar15->Min = dVar19;
              dVar19 = pIVar10->ExtentsY[iVar3].Max;
              if (dVar9 <= dVar19) {
                dVar9 = dVar19;
              }
              pIVar10->ExtentsY[iVar3].Max = dVar9;
            }
          }
        }
        else if ((((long)ABS(dVar9) < 0x7ff0000000000000) && ((pIVar8->XAxis).Range.Min <= 0.0)) &&
                (0.0 <= (pIVar8->XAxis).Range.Max)) goto LAB_001f9d75;
        dVar9 = (double)iVar6;
        dVar18 = dVar18 + dVar21;
        if ((uVar4 >> 10 & 1) == 0) {
          if ((0 < iVar6) || ((uVar4 & 0x20) == 0)) {
LAB_001f9dda:
            dVar19 = (pIVar10->ExtentsX).Min;
            dVar20 = dVar9;
            if (dVar19 <= dVar9) {
              dVar20 = dVar19;
            }
            (pIVar10->ExtentsX).Min = dVar20;
            dVar19 = (pIVar10->ExtentsX).Max;
            dVar20 = dVar9;
            if (dVar9 <= dVar19) {
              dVar20 = dVar19;
            }
            (pIVar10->ExtentsX).Max = dVar20;
          }
        }
        else if (((pIVar8->YAxis[iVar3].Range.Min <= dVar18) &&
                 (dVar18 <= pIVar8->YAxis[iVar3].Range.Max)) &&
                (local_5c = (byte)((uVar4 & 0x20) >> 5), (iVar6 < 1 & local_5c) == 0))
        goto LAB_001f9dda;
        if ((uVar5 >> 10 & 1) == 0) {
          if ((long)ABS(dVar18) < 0x7ff0000000000000) {
LAB_001f9e38:
            if ((0.0 < dVar18) || ((uVar5 & 0x20) == 0)) {
              dVar9 = dVar18;
              if (pIVar15->Min <= dVar18) {
                dVar9 = pIVar15->Min;
              }
              pIVar15->Min = dVar9;
              dVar9 = pIVar10->ExtentsY[iVar3].Max;
              if (dVar18 <= dVar9) {
                dVar18 = dVar9;
              }
              pIVar10->ExtentsY[iVar3].Max = dVar18;
            }
          }
        }
        else if ((((long)ABS(dVar18) < 0x7ff0000000000000) && ((pIVar8->XAxis).Range.Min <= dVar9))
                && (dVar9 <= (pIVar8->XAxis).Range.Max)) goto LAB_001f9e38;
        dVar17 = dVar17 + 1.0;
        iVar13 = iVar13 + 1;
      } while (iVar12 != iVar13);
    }
    this = GetPlotDrawList();
    col = ImGui::GetColorU32((pIVar10->NextItemData).Colors);
    col_00 = ImGui::GetColorU32((pIVar10->NextItemData).Colors + 1);
    iVar12 = getter->Count;
    if (0 < iVar12) {
      bVar11 = (pIVar10->NextItemData).RenderFill;
      bVar1 = (pIVar10->NextItemData).RenderLine;
      iVar14 = 0;
      do {
        iVar12 = *(int *)((long)getter->Xs +
                         (long)(((getter->Offset + iVar14) % iVar12 + iVar12) % iVar12) *
                         (long)getter->Stride);
        if (iVar12 != 0) {
          dVar16 = (double)iVar14 + getter->YShift;
          local_38 = PlotToPixels(0.0,dVar16 - dVar21,-1);
          local_40 = PlotToPixels((double)iVar12,dVar16 + dVar21,-1);
          if ((pIVar10->NextItemData).RenderFill == true) {
            ImDrawList::AddRectFilled(this,&local_38,&local_40,col_00,0.0,0);
          }
          if (((bVar11 ^ 1U | col != col_00) & bVar1) != 0) {
            ImDrawList::AddRect(this,&local_38,&local_40,col,0.0,0xf0,
                                (pIVar10->NextItemData).LineWeight);
          }
        }
        iVar14 = iVar14 + 1;
        iVar12 = getter->Count;
      } while (iVar14 < iVar12);
    }
    pIVar10 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar10->NextItemData);
    pIVar10->PreviousItem = pIVar10->CurrentItem;
    pIVar10->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

void PlotBarsHEx(const char* label_id, const Getter& getter, THeight height) {
    if (BeginItem(label_id, ImPlotCol_Fill)) {
        const THeight half_height = height / 2;
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPoint p = getter(i);
                FitPoint(ImPlotPoint(0, p.y - half_height));
                FitPoint(ImPlotPoint(p.x, p.y + half_height));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        ImU32 col_line  = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
        ImU32 col_fill  = ImGui::GetColorU32(s.Colors[ImPlotCol_Fill]);
        bool  rend_line = s.RenderLine;
        if (s.RenderFill && col_line == col_fill)
            rend_line = false;
        for (int i = 0; i < getter.Count; ++i) {
            ImPlotPoint p = getter(i);
            if (p.x == 0)
                continue;
            ImVec2 a = PlotToPixels(0, p.y - half_height);
            ImVec2 b = PlotToPixels(p.x, p.y + half_height);
            if (s.RenderFill)
                DrawList.AddRectFilled(a, b, col_fill);
            if (rend_line)
                DrawList.AddRect(a, b, col_line, 0, ImDrawFlags_RoundCornersAll, s.LineWeight);
        }
        EndItem();
    }
}